

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O1

void __thiscall
Signal<std::shared_ptr<Reaction>_>::Emit
          (Signal<std::shared_ptr<Reaction>_> *this,shared_ptr<Reaction> *p)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  _Rb_tree_header *p_Var3;
  pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> it;
  shared_ptr<Reaction> local_68;
  _Rb_tree_color local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  p_Var1 = (this->slots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->slots_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    do {
      local_58 = p_Var1[1]._M_color;
      std::function<void_(std::shared_ptr<Reaction>)>::function
                ((function<void_(std::shared_ptr<Reaction>)> *)&local_50,
                 (function<void_(std::shared_ptr<Reaction>)> *)&p_Var1[1]._M_parent);
      local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (p->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (p->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_40 == (code *)0x0) {
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*local_38)(&local_50,&local_68);
      if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  return;
}

Assistant:

void Emit(Args... p) {
    for (auto it : slots_) {
      it.second(p...);
    }
  }